

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3IndexAffinityOk(Expr *pExpr,char idx_affinity)

{
  char cVar1;
  char aff;
  char idx_affinity_local;
  Expr *pExpr_local;
  
  cVar1 = comparisonAffinity(pExpr);
  if (cVar1 < 'B') {
    pExpr_local._4_4_ = 1;
  }
  else if (cVar1 == 'B') {
    pExpr_local._4_4_ = (uint)(idx_affinity == 'B');
  }
  else {
    pExpr_local._4_4_ = (uint)('B' < idx_affinity);
  }
  return pExpr_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3IndexAffinityOk(const Expr *pExpr, char idx_affinity){
  char aff = comparisonAffinity(pExpr);
  if( aff<SQLITE_AFF_TEXT ){
    return 1;
  }
  if( aff==SQLITE_AFF_TEXT ){
    return idx_affinity==SQLITE_AFF_TEXT;
  }
  return sqlite3IsNumericAffinity(idx_affinity);
}